

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TImage.cpp
# Opt level: O0

void __thiscall TUPU::TImage::setBinary(TImage *this,void *buf,size_t buf_len,string *filename)

{
  void *pvVar1;
  string *in_RCX;
  size_t in_RDX;
  void *in_RSI;
  long in_RDI;
  
  *(size_t *)(in_RDI + 0x98) = in_RDX;
  std::__cxx11::string::operator=((string *)(in_RDI + 0xa0),in_RCX);
  pvVar1 = malloc(in_RDX);
  *(void **)(in_RDI + 0x90) = pvVar1;
  memcpy(*(void **)(in_RDI + 0x90),in_RSI,in_RDX);
  std::__cxx11::string::clear();
  std::__cxx11::string::clear();
  return;
}

Assistant:

void TImage::setBinary(const void * buf, size_t buf_len, const string & filename)
{
    m_len = buf_len;
    m_filename = filename;
    m_buffer = std::malloc(buf_len);
    memcpy(m_buffer, buf, buf_len);

    m_url.clear();
    m_path.clear();
}